

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::detail::_MemoryResourceSingleChunk::release(_MemoryResourceSingleChunk *this)

{
  if ((this->m_mem != (char *)0x0) && (this->m_owner == true)) {
    (**(code **)(*(long *)this + 0x20))(this,this->m_mem,this->m_size,0x10);
  }
  *(undefined8 *)((long)&this->m_size + 1) = 0;
  *(undefined8 *)((long)&this->m_pos + 1) = 0;
  this->m_mem = (char *)0x0;
  this->m_size = 0;
  return;
}

Assistant:

void detail::_MemoryResourceSingleChunk::release()
{
    if(m_mem && m_owner)
    {
        impl_type::deallocate(m_mem, m_size);
    }
    m_mem = nullptr;
    m_size = 0;
    m_owner = false;
    m_pos = 0;
}